

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qtextbrowser.cpp
# Opt level: O2

void QTextBrowser::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QArrayDataPointer<QString> *this;
  Data *pDVar1;
  long lVar2;
  bool bVar3;
  undefined1 uVar4;
  undefined4 uVar5;
  code *UNRECOVERED_JUMPTABLE_00;
  QStringList *paths;
  long in_FS_OFFSET;
  QArrayDataPointer<QString> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        backwardAvailable((QTextBrowser *)_o,*_a[1]);
        return;
      }
      break;
    case 1:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        forwardAvailable((QTextBrowser *)_o,*_a[1]);
        return;
      }
      break;
    case 2:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        historyChanged((QTextBrowser *)_o);
        return;
      }
      break;
    case 3:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        sourceChanged((QTextBrowser *)_o,(QUrl *)_a[1]);
        return;
      }
      break;
    case 4:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        highlighted((QTextBrowser *)_o,(QUrl *)_a[1]);
        return;
      }
      break;
    case 5:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        anchorClicked((QTextBrowser *)_o,(QUrl *)_a[1]);
        return;
      }
      break;
    case 6:
      paths = (QStringList *)_a[1];
      uVar5 = *_a[2];
      UNRECOVERED_JUMPTABLE_00 = *(code **)(*(long *)_o + 0x210);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_18) break;
      goto LAB_004675fe;
    case 7:
      paths = (QStringList *)_a[1];
switchD_00467315_caseD_0:
      UNRECOVERED_JUMPTABLE_00 = *(code **)(*(long *)_o + 0x210);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        uVar5 = 0;
LAB_004675fe:
        (*UNRECOVERED_JUMPTABLE_00)(_o,paths,uVar5,UNRECOVERED_JUMPTABLE_00);
        return;
      }
      break;
    case 8:
      UNRECOVERED_JUMPTABLE_00 = *(code **)(*(long *)_o + 0x1f0);
      goto LAB_0046761d;
    case 9:
      UNRECOVERED_JUMPTABLE_00 = *(code **)(*(long *)_o + 0x1f8);
      goto LAB_0046761d;
    case 10:
      UNRECOVERED_JUMPTABLE_00 = *(code **)(*(long *)_o + 0x200);
      goto LAB_0046761d;
    case 0xb:
      UNRECOVERED_JUMPTABLE_00 = *(code **)(*(long *)_o + 0x208);
LAB_0046761d:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        (*UNRECOVERED_JUMPTABLE_00)
                  (_o,&switchD_004672ae::switchdataD_00665f90,*(long *)(in_FS_OFFSET + 0x28),
                   UNRECOVERED_JUMPTABLE_00);
        return;
      }
      break;
    default:
      goto switchD_004672ae_caseD_3;
    }
    goto LAB_00467655;
  case ReadProperty:
    if (4 < (uint)_id) break;
    this = (QArrayDataPointer<QString> *)*_a;
    switch(_id) {
    case 0:
      source((QTextBrowser *)&local_30);
      pDVar1 = this->d;
      this->d = local_30.d;
      local_30.d = pDVar1;
      QUrl::~QUrl((QUrl *)&local_30);
      break;
    case 1:
      lVar2 = *(long *)(*(long *)(_o + 8) + 0x3d8);
      if (lVar2 == 0) {
        uVar5 = 0;
      }
      else {
        uVar5 = *(undefined4 *)(*(long *)(*(long *)(_o + 8) + 0x3d0) + -8 + lVar2 * 0x38);
      }
      *(undefined4 *)&this->d = uVar5;
      break;
    case 2:
      searchPaths((QStringList *)&local_30,(QTextBrowser *)_o);
      QArrayDataPointer<QString>::operator=(this,&local_30);
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_30);
      break;
    case 3:
      uVar4 = *(undefined1 *)(*(long *)(_o + 8) + 0x422);
      goto LAB_0046749d;
    case 4:
      uVar4 = *(undefined1 *)(*(long *)(_o + 8) + 0x423);
LAB_0046749d:
      *(undefined1 *)&this->d = uVar4;
    }
    break;
  case WriteProperty:
    if ((uint)_id < 5) {
      paths = (QStringList *)*_a;
      switch(_id) {
      case 0:
        goto switchD_00467315_caseD_0;
      case 2:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setSearchPaths((QTextBrowser *)_o,paths);
          return;
        }
        goto LAB_00467655;
      case 3:
        *(undefined1 *)(*(long *)(_o + 8) + 0x422) = *(undefined1 *)&(paths->d).d;
        break;
      case 4:
        *(undefined1 *)(*(long *)(_o + 8) + 0x423) = *(undefined1 *)&(paths->d).d;
      }
    }
    break;
  case IndexOfMethod:
    bVar3 = QtMocHelpers::indexOfMethod<void(QTextBrowser::*)(bool)>
                      ((QtMocHelpers *)_a,(void **)backwardAvailable,0,0);
    if ((((!bVar3) &&
         (bVar3 = QtMocHelpers::indexOfMethod<void(QTextBrowser::*)(bool)>
                            ((QtMocHelpers *)_a,(void **)forwardAvailable,0,1), !bVar3)) &&
        (bVar3 = QtMocHelpers::indexOfMethod<void(QTextBrowser::*)()>
                           ((QtMocHelpers *)_a,(void **)historyChanged,0,2), !bVar3)) &&
       ((bVar3 = QtMocHelpers::indexOfMethod<void(QTextBrowser::*)(QUrl_const&)>
                           ((QtMocHelpers *)_a,(void **)sourceChanged,0,3), !bVar3 &&
        (bVar3 = QtMocHelpers::indexOfMethod<void(QTextBrowser::*)(QUrl_const&)>
                           ((QtMocHelpers *)_a,(void **)highlighted,0,4), !bVar3)))) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        QtMocHelpers::indexOfMethod<void(QTextBrowser::*)(QUrl_const&)>
                  ((QtMocHelpers *)_a,(void **)anchorClicked,0,5);
        return;
      }
      goto LAB_00467655;
    }
  }
switchD_004672ae_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
LAB_00467655:
  __stack_chk_fail();
}

Assistant:

void QTextBrowser::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QTextBrowser *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->backwardAvailable((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 1: _t->forwardAvailable((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 2: _t->historyChanged(); break;
        case 3: _t->sourceChanged((*reinterpret_cast< std::add_pointer_t<QUrl>>(_a[1]))); break;
        case 4: _t->highlighted((*reinterpret_cast< std::add_pointer_t<QUrl>>(_a[1]))); break;
        case 5: _t->anchorClicked((*reinterpret_cast< std::add_pointer_t<QUrl>>(_a[1]))); break;
        case 6: _t->setSource((*reinterpret_cast< std::add_pointer_t<QUrl>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QTextDocument::ResourceType>>(_a[2]))); break;
        case 7: _t->setSource((*reinterpret_cast< std::add_pointer_t<QUrl>>(_a[1]))); break;
        case 8: _t->backward(); break;
        case 9: _t->forward(); break;
        case 10: _t->home(); break;
        case 11: _t->reload(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QTextBrowser::*)(bool )>(_a, &QTextBrowser::backwardAvailable, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTextBrowser::*)(bool )>(_a, &QTextBrowser::forwardAvailable, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTextBrowser::*)()>(_a, &QTextBrowser::historyChanged, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTextBrowser::*)(const QUrl & )>(_a, &QTextBrowser::sourceChanged, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTextBrowser::*)(const QUrl & )>(_a, &QTextBrowser::highlighted, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTextBrowser::*)(const QUrl & )>(_a, &QTextBrowser::anchorClicked, 5))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QUrl*>(_v) = _t->source(); break;
        case 1: *reinterpret_cast<QTextDocument::ResourceType*>(_v) = _t->sourceType(); break;
        case 2: *reinterpret_cast<QStringList*>(_v) = _t->searchPaths(); break;
        case 3: *reinterpret_cast<bool*>(_v) = _t->openExternalLinks(); break;
        case 4: *reinterpret_cast<bool*>(_v) = _t->openLinks(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setSource(*reinterpret_cast<QUrl*>(_v)); break;
        case 2: _t->setSearchPaths(*reinterpret_cast<QStringList*>(_v)); break;
        case 3: _t->setOpenExternalLinks(*reinterpret_cast<bool*>(_v)); break;
        case 4: _t->setOpenLinks(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
}